

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O0

void Hop_ManCleanData(Hop_Man_t *p)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  undefined8 *puVar3;
  int local_1c;
  int i;
  Hop_Obj_t *pObj;
  Hop_Man_t *p_local;
  
  p->nTravIds = 1;
  pHVar2 = Hop_ManConst1(p);
  (pHVar2->field_0).pData = (void *)0x0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vPis), local_1c < iVar1; local_1c = local_1c + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(p->vPis,local_1c);
    *puVar3 = 0;
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vPos), local_1c < iVar1; local_1c = local_1c + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(p->vPos,local_1c);
    *puVar3 = 0;
  }
  for (local_1c = 0; local_1c < p->nTableSize; local_1c = local_1c + 1) {
    if (p->pTable[local_1c] != (Hop_Obj_t *)0x0) {
      (p->pTable[local_1c]->field_0).pData = (void *)0x0;
    }
  }
  return;
}

Assistant:

void Hop_ManCleanData( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    p->nTravIds = 1;
    Hop_ManConst1(p)->pData = NULL;
    Hop_ManForEachPi( p, pObj, i )
        pObj->pData = NULL;
    Hop_ManForEachPo( p, pObj, i )
        pObj->pData = NULL;
    Hop_ManForEachNode( p, pObj, i )
        pObj->pData = NULL;
}